

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsq.hpp
# Opt level: O0

Node * __thiscall
tf::BoundedTaskQueue<tf::Node_*,_8UL>::pop(BoundedTaskQueue<tf::Node_*,_8UL> *this)

{
  long *plVar1;
  long lVar2;
  long *in_RDI;
  Node *item;
  int64_t t;
  int64_t b;
  memory_order __b_4;
  memory_order __b_3;
  memory_order __b_1;
  memory_order __b_2;
  memory_order __b;
  undefined8 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb8;
  undefined4 in_stack_fffffffffffffdbc;
  __pointer_type local_e0;
  long local_d8;
  long local_d0;
  int local_b4;
  long local_b0;
  long *local_a8;
  int local_94;
  long local_90;
  long *local_88;
  long local_80;
  memory_order local_78;
  int local_74;
  long local_70;
  long *local_68;
  long local_60;
  memory_order local_58;
  int local_54;
  long local_48;
  memory_order local_40;
  int local_3c;
  long *local_38;
  undefined4 local_30;
  undefined1 local_29;
  long local_28;
  undefined4 local_20;
  undefined4 local_1c;
  long local_18;
  long *local_10;
  
  plVar1 = in_RDI + 0x10;
  local_3c = 0;
  local_38 = plVar1;
  local_40 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_3c - 1U < 2) {
    local_48 = *plVar1;
  }
  else if (local_3c == 5) {
    local_48 = *plVar1;
  }
  else {
    local_48 = *plVar1;
  }
  local_d0 = local_48 + -1;
  plVar1 = in_RDI + 0x10;
  local_74 = 0;
  local_70 = local_d0;
  local_68 = plVar1;
  local_78 = std::operator&(memory_order_relaxed,__memory_order_mask);
  local_80 = local_70;
  if (local_74 == 3) {
    *plVar1 = local_70;
  }
  else if (local_74 == 5) {
    LOCK();
    *plVar1 = local_70;
    UNLOCK();
  }
  else {
    *plVar1 = local_70;
  }
  local_30 = 5;
  local_54 = 0;
  local_58 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_54 - 1U < 2) {
    local_60 = *in_RDI;
  }
  else if (local_54 == 5) {
    local_60 = *in_RDI;
  }
  else {
    local_60 = *in_RDI;
  }
  local_d8 = local_60;
  local_e0 = (__pointer_type)0x0;
  if (local_d0 < local_60) {
    plVar1 = in_RDI + 0x10;
    local_b0 = local_d0 + 1;
    local_b4 = 0;
    local_a8 = plVar1;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_b4 == 3) {
      *plVar1 = local_b0;
    }
    else if (local_b4 == 5) {
      LOCK();
      *plVar1 = local_b0;
      UNLOCK();
    }
    else {
      *plVar1 = local_b0;
    }
  }
  else {
    local_e0 = std::atomic<tf::Node_*>::load
                         ((atomic<tf::Node_*> *)
                          CONCAT44(in_stack_fffffffffffffdbc,in_stack_fffffffffffffdb8),
                          (memory_order)((ulong)in_stack_fffffffffffffdb0 >> 0x20));
    if (local_d8 == local_d0) {
      local_28 = local_d8 + 1;
      local_10 = &local_d8;
      local_1c = 5;
      local_20 = 0;
      LOCK();
      lVar2 = *in_RDI;
      local_29 = local_d8 == lVar2;
      if ((bool)local_29) {
        *in_RDI = local_28;
        lVar2 = local_d8;
      }
      UNLOCK();
      if (!(bool)local_29) {
        local_e0 = (__pointer_type)0x0;
        local_d8 = lVar2;
      }
      plVar1 = in_RDI + 0x10;
      local_90 = local_d0 + 1;
      local_94 = 0;
      local_88 = plVar1;
      local_18 = local_28;
      std::operator&(memory_order_relaxed,__memory_order_mask);
      if (local_94 == 3) {
        *plVar1 = local_90;
      }
      else if (local_94 == 5) {
        LOCK();
        *plVar1 = local_90;
        UNLOCK();
      }
      else {
        *plVar1 = local_90;
      }
    }
  }
  return local_e0;
}

Assistant:

T BoundedTaskQueue<T, LogSize>::pop() {

  int64_t b = _bottom.load(std::memory_order_relaxed) - 1;
  _bottom.store(b, std::memory_order_relaxed);
  std::atomic_thread_fence(std::memory_order_seq_cst);
  int64_t t = _top.load(std::memory_order_relaxed);

  T item {nullptr};

  if(t <= b) {
    item = _buffer[b & BufferMask].load(std::memory_order_relaxed);
    if(t == b) {
      // the last item just got stolen
      if(!_top.compare_exchange_strong(t, t+1, 
                                       std::memory_order_seq_cst, 
                                       std::memory_order_relaxed)) {
        item = nullptr;
      }
      _bottom.store(b + 1, std::memory_order_relaxed);
    }
  }
  else {
    _bottom.store(b + 1, std::memory_order_relaxed);
  }

  return item;
}